

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_RSAPSS.c
# Opt level: O2

_Bool Hacl_RSAPSS_rsapss_pkey_verify
                (Spec_Hash_Definitions_hash_alg a,uint32_t modBits,uint32_t eBits,uint8_t *nb,
                uint8_t *eb,uint32_t saltLen,uint32_t sgntLen,uint8_t *sgnt,uint32_t msgLen,
                uint8_t *msg)

{
  int iVar1;
  long lVar2;
  uint8_t *eb_00;
  uint32_t saltLen_00;
  Spec_Hash_Definitions_hash_alg a_00;
  _Bool _Var3;
  _Bool _Var4;
  undefined7 in_register_00000039;
  uint64_t *pkey;
  undefined8 auStack_70 [2];
  ulong auStack_60 [3];
  uint64_t uStack_48;
  uint8_t *local_40;
  uint32_t local_38;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000039,a);
  iVar1 = (eBits - 1 >> 6) + (modBits - 1 >> 6) * 2;
  lVar2 = -(ulong)(iVar1 * 8 + 0x27U & 0xfffffff0);
  pkey = (uint64_t *)((long)&uStack_48 + lVar2);
  _Var4 = false;
  local_40 = eb;
  local_38 = saltLen;
  *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x152277;
  memset(pkey,0,(ulong)(uint)(iVar1 * 8) + 0x18);
  eb_00 = local_40;
  *(undefined8 *)((long)auStack_60 + lVar2 + 0x10) = 0x15228c;
  _Var3 = load_pkey(modBits,eBits,nb,eb_00,pkey);
  saltLen_00 = local_38;
  if (_Var3) {
    a_00 = (Spec_Hash_Definitions_hash_alg)local_34;
    *(uint8_t **)((long)auStack_60 + lVar2 + 8) = msg;
    *(ulong *)((long)auStack_60 + lVar2) = (ulong)msgLen;
    *(uint8_t **)((long)auStack_70 + lVar2 + 8) = sgnt;
    *(undefined8 *)((long)auStack_70 + lVar2) = 0x1522b8;
    _Var4 = Hacl_RSAPSS_rsapss_verify
                      (a_00,modBits,eBits,pkey,saltLen_00,sgntLen,
                       *(uint8_t **)((long)auStack_70 + lVar2 + 8),
                       *(uint32_t *)((long)auStack_60 + lVar2),
                       *(uint8_t **)((long)auStack_60 + lVar2 + 8));
  }
  return _Var4;
}

Assistant:

bool
Hacl_RSAPSS_rsapss_pkey_verify(
  Spec_Hash_Definitions_hash_alg a,
  uint32_t modBits,
  uint32_t eBits,
  uint8_t *nb,
  uint8_t *eb,
  uint32_t saltLen,
  uint32_t sgntLen,
  uint8_t *sgnt,
  uint32_t msgLen,
  uint8_t *msg
)
{
  KRML_CHECK_SIZE(sizeof (uint64_t), 2U * ((modBits - 1U) / 64U + 1U) + (eBits - 1U) / 64U + 1U);
  uint64_t pkey[2U * ((modBits - 1U) / 64U + 1U) + (eBits - 1U) / 64U + 1U];
  memset(pkey,
    0U,
    (2U * ((modBits - 1U) / 64U + 1U) + (eBits - 1U) / 64U + 1U) * sizeof (uint64_t));
  bool b = load_pkey(modBits, eBits, nb, eb, pkey);
  if (b)
  {
    return Hacl_RSAPSS_rsapss_verify(a, modBits, eBits, pkey, saltLen, sgntLen, sgnt, msgLen, msg);
  }
  return false;
}